

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O0

void __thiscall
density::
lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
::consume_operation::commit(consume_operation *this)

{
  bool bVar1;
  FunctionRuntimeType<(density::function_type_erasure)1,_int_(float,_double)> *this_00;
  void *i_dest;
  void *element;
  FunctionRuntimeType<(density::function_type_erasure)1,_int_(float,_double)> *type;
  consume_operation *this_local;
  
  bVar1 = empty(this);
  if (bVar1) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/lf_heter_queue.h"
               ,0x3a7);
  }
  this_00 = complete_type(this);
  i_dest = element_ptr(this);
  detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(float,_double)>::destroy
            (this_00,i_dest);
  detail::
  LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
  ::Consume::commit_consume_impl(&this->m_consume_data);
  return;
}

Assistant:

void commit() noexcept
            {
                DENSITY_ASSERT(!empty());

                auto const & type    = complete_type();
                auto const   element = element_ptr();
                type.destroy(element);

                type.RUNTIME_TYPE::~RUNTIME_TYPE();

                m_consume_data.commit_consume_impl();
            }